

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p5_pbev2.cc
# Opt level: O2

int PKCS5_pbe2_decrypt_init
              (pbe_suite *suite,EVP_CIPHER_CTX *ctx,char *pass,size_t pass_len,CBS *param)

{
  uint8_t *puVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  EVP_CIPHER *cipher;
  EVP_MD *pbkdf2_md;
  int iVar5;
  long lVar6;
  CBS iv;
  CBS pbkdf2_params;
  uint64_t iterations;
  CBS enc_scheme;
  CBS kdf;
  CBS pbe_param;
  CBS prf;
  CBS null;
  CBS salt;
  CBS enc_obj;
  CBS kdf_obj;
  
  iVar3 = CBS_get_asn1(param,&pbe_param,0x20000010);
  if (((((iVar3 == 0) || (param->len != 0)) ||
       (iVar3 = CBS_get_asn1(&pbe_param,&kdf,0x20000010), iVar3 == 0)) ||
      ((iVar3 = CBS_get_asn1(&pbe_param,&enc_scheme,0x20000010), iVar3 == 0 || (pbe_param.len != 0))
      )) || ((iVar3 = CBS_get_asn1(&kdf,&kdf_obj,6), iVar3 == 0 ||
             (iVar3 = CBS_get_asn1(&enc_scheme,&enc_obj,6), iVar3 == 0)))) {
    iVar3 = 0x68;
    iVar5 = 0xba;
  }
  else {
    iVar3 = CBS_mem_equal(&kdf_obj,kPBKDF2,9);
    if (iVar3 == 0) {
      iVar3 = 0x80;
      iVar5 = 0xc0;
      goto LAB_002d2055;
    }
    lVar2 = 0;
    do {
      lVar6 = lVar2;
      if (lVar6 == 0x78) goto LAB_002d2278;
      iVar3 = CBS_mem_equal(&enc_obj,kCipherOIDs[0].oid + lVar6,(ulong)kCipherOIDs[0].oid[lVar6 + 9]
                           );
      lVar2 = lVar6 + 0x18;
    } while (iVar3 == 0);
    cipher = (EVP_CIPHER *)(**(code **)(kCipherOIDs[0].oid + lVar6 + 0x10))();
    if (cipher == (EVP_CIPHER *)0x0) {
LAB_002d2278:
      iVar3 = 0x7f;
      iVar5 = 199;
      goto LAB_002d2055;
    }
    iVar3 = CBS_get_asn1(&kdf,&pbkdf2_params,0x20000010);
    if (((iVar3 == 0) || (kdf.len != 0)) ||
       ((iVar3 = CBS_get_asn1(&pbkdf2_params,&salt,4), iVar3 == 0 ||
        (iVar3 = CBS_get_asn1_uint64(&pbkdf2_params,&iterations), iVar3 == 0)))) {
      iVar3 = 0x68;
      iVar5 = 0xd2;
      goto LAB_002d2055;
    }
    iVar3 = pkcs12_iterations_acceptable(CONCAT44(iterations._4_4_,(uint32_t)iterations));
    if (iVar3 == 0) {
      iVar3 = 0x81;
      iVar5 = 0xd7;
      goto LAB_002d2055;
    }
    iVar3 = CBS_peek_asn1_tag(&pbkdf2_params,2);
    if (iVar3 != 0) {
      iVar3 = CBS_get_asn1_uint64(&pbkdf2_params,(uint64_t *)&iv);
      puVar1 = iv.data;
      if (iVar3 == 0) {
        iVar3 = 0x68;
        iVar5 = 0xe0;
        goto LAB_002d238d;
      }
      uVar4 = EVP_CIPHER_key_length(cipher);
      if (puVar1 != (uint8_t *)(ulong)uVar4) {
        iVar3 = 0x7d;
        iVar5 = 0xe5;
        goto LAB_002d238d;
      }
    }
    pbkdf2_md = EVP_sha1();
    if (pbkdf2_params.len != 0) {
      iVar3 = CBS_get_asn1(&pbkdf2_params,&iv,0x20000010);
      if (((iVar3 == 0) || (iVar3 = CBS_get_asn1(&iv,&prf,6), iVar3 == 0)) ||
         (pbkdf2_params.len != 0)) {
        iVar3 = 0x68;
        iVar5 = 0xf0;
LAB_002d238d:
        ERR_put_error(0x13,0,iVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                      ,iVar5);
        return 0;
      }
      iVar3 = CBS_mem_equal(&prf,kHMACWithSHA1,8);
      if (iVar3 == 0) {
        iVar3 = CBS_mem_equal(&prf,kHMACWithSHA256,8);
        if (iVar3 == 0) {
          iVar3 = 0x82;
          iVar5 = 0xfb;
          goto LAB_002d238d;
        }
        pbkdf2_md = EVP_sha256();
      }
      else {
        pbkdf2_md = EVP_sha1();
      }
      iVar3 = CBS_get_asn1(&iv,&null,5);
      if (((iVar3 == 0) || (null.len != 0)) || (iv.len != 0)) {
        iVar3 = 0x68;
        iVar5 = 0x104;
        goto LAB_002d2055;
      }
    }
    iVar3 = CBS_get_asn1(&enc_scheme,&iv,4);
    if ((iVar3 != 0) && (enc_scheme.len == 0)) {
      iVar3 = pkcs5_pbe2_cipher_init
                        (ctx,(EVP_CIPHER *)cipher,(EVP_MD *)pbkdf2_md,(uint32_t)iterations,pass,
                         pass_len,salt.data,salt.len,iv.data,iv.len,0);
      return iVar3;
    }
    iVar3 = 0x82;
    iVar5 = 0x110;
  }
LAB_002d2055:
  ERR_put_error(0x13,0,iVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                ,iVar5);
  return 0;
}

Assistant:

int PKCS5_pbe2_decrypt_init(const struct pbe_suite *suite, EVP_CIPHER_CTX *ctx,
                            const char *pass, size_t pass_len, CBS *param) {
  CBS pbe_param, kdf, kdf_obj, enc_scheme, enc_obj;
  if (!CBS_get_asn1(param, &pbe_param, CBS_ASN1_SEQUENCE) ||
      CBS_len(param) != 0 ||
      !CBS_get_asn1(&pbe_param, &kdf, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&pbe_param, &enc_scheme, CBS_ASN1_SEQUENCE) ||
      CBS_len(&pbe_param) != 0 ||
      !CBS_get_asn1(&kdf, &kdf_obj, CBS_ASN1_OBJECT) ||
      !CBS_get_asn1(&enc_scheme, &enc_obj, CBS_ASN1_OBJECT)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
    return 0;
  }

  // Only PBKDF2 is supported.
  if (!CBS_mem_equal(&kdf_obj, kPBKDF2, sizeof(kPBKDF2))) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_KEY_DERIVATION_FUNCTION);
    return 0;
  }

  // See if we recognise the encryption algorithm.
  const EVP_CIPHER *cipher = cbs_to_cipher(&enc_obj);
  if (cipher == NULL) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_CIPHER);
    return 0;
  }

  // Parse the KDF parameters. See RFC 8018, appendix A.2.
  CBS pbkdf2_params, salt;
  uint64_t iterations;
  if (!CBS_get_asn1(&kdf, &pbkdf2_params, CBS_ASN1_SEQUENCE) ||
      CBS_len(&kdf) != 0 ||
      !CBS_get_asn1(&pbkdf2_params, &salt, CBS_ASN1_OCTETSTRING) ||
      !CBS_get_asn1_uint64(&pbkdf2_params, &iterations)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
    return 0;
  }

  if (!pkcs12_iterations_acceptable(iterations)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_ITERATION_COUNT);
    return 0;
  }

  // The optional keyLength parameter, if present, must match the key length of
  // the cipher.
  if (CBS_peek_asn1_tag(&pbkdf2_params, CBS_ASN1_INTEGER)) {
    uint64_t key_len;
    if (!CBS_get_asn1_uint64(&pbkdf2_params, &key_len)) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
      return 0;
    }

    if (key_len != EVP_CIPHER_key_length(cipher)) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_KEYLENGTH);
      return 0;
    }
  }

  const EVP_MD *md = EVP_sha1();
  if (CBS_len(&pbkdf2_params) != 0) {
    CBS alg_id, prf;
    if (!CBS_get_asn1(&pbkdf2_params, &alg_id, CBS_ASN1_SEQUENCE) ||
        !CBS_get_asn1(&alg_id, &prf, CBS_ASN1_OBJECT) ||
        CBS_len(&pbkdf2_params) != 0) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
      return 0;
    }

    if (CBS_mem_equal(&prf, kHMACWithSHA1, sizeof(kHMACWithSHA1))) {
      // hmacWithSHA1 is the DEFAULT, so DER requires it be omitted, but we
      // match OpenSSL in tolerating it being present.
      md = EVP_sha1();
    } else if (CBS_mem_equal(&prf, kHMACWithSHA256, sizeof(kHMACWithSHA256))) {
      md = EVP_sha256();
    } else {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_PRF);
      return 0;
    }

    // All supported PRFs use a NULL parameter.
    CBS null;
    if (!CBS_get_asn1(&alg_id, &null, CBS_ASN1_NULL) ||
        CBS_len(&null) != 0 ||
        CBS_len(&alg_id) != 0) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
      return 0;
    }
  }

  // Parse the encryption scheme parameters. Note OpenSSL does not match the
  // specification. Per RFC 2898, this should depend on the encryption scheme.
  // In particular, RC2-CBC uses a SEQUENCE with version and IV. We align with
  // OpenSSL.
  CBS iv;
  if (!CBS_get_asn1(&enc_scheme, &iv, CBS_ASN1_OCTETSTRING) ||
      CBS_len(&enc_scheme) != 0) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_PRF);
    return 0;
  }

  return pkcs5_pbe2_cipher_init(ctx, cipher, md, (uint32_t)iterations, pass,
                                pass_len, CBS_data(&salt), CBS_len(&salt),
                                CBS_data(&iv), CBS_len(&iv), 0 /* decrypt */);
}